

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_funcinfo(lua_State *L)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  BCLine val;
  GCproto *pt;
  GCstr *key;
  TValue *pTVar4;
  uint uVar5;
  char *pcVar6;
  GCtab *pGVar7;
  ulong uVar8;
  
  pt = check_Lproto(L,1);
  pTVar4 = L->base;
  if (pt == (GCproto *)0x0) {
    uVar8 = (ulong)(pTVar4->u32).lo;
    lua_createtable(L,0,4);
    pGVar7 = (GCtab *)(ulong)L->top[-1].u32.lo;
    if (*(byte *)(uVar8 + 6) != 1) {
      setintfield(L,pGVar7,"ffid",(uint)*(byte *)(uVar8 + 6));
    }
    key = lj_str_new(L,"addr",4);
    pTVar4 = lj_tab_setstr(L,pGVar7,key);
    pTVar4->n = (double)*(long *)(uVar8 + 0x18);
    setintfield(L,pGVar7,"upvalues",(uint)*(byte *)(uVar8 + 7));
    return 1;
  }
  uVar3 = 0;
  if ((pTVar4 + 1 < L->top) && (uVar3 = 0, *(int *)((long)pTVar4 + 0xc) != -1)) {
    uVar3 = lj_lib_checkint(L,2);
  }
  lua_createtable(L,0,0x10);
  pGVar7 = (GCtab *)(ulong)L->top[-1].u32.lo;
  setintfield(L,pGVar7,"linedefined",pt->firstline);
  setintfield(L,pGVar7,"lastlinedefined",pt->numline + pt->firstline);
  setintfield(L,pGVar7,"stackslots",(uint)pt->framesize);
  setintfield(L,pGVar7,"params",(uint)pt->numparams);
  setintfield(L,pGVar7,"bytecodes",pt->sizebc);
  setintfield(L,pGVar7,"gcconsts",pt->sizekgc);
  setintfield(L,pGVar7,"nconsts",pt->sizekn);
  setintfield(L,pGVar7,"upvalues",(uint)pt->sizeuv);
  if (uVar3 < pt->sizebc) {
    val = lj_debug_line(pt,uVar3);
    setintfield(L,pGVar7,"currentline",val);
  }
  (L->top->field_2).it = ((pt->flags & 2) == 0) - 3;
  pTVar4 = L->top;
  L->top = pTVar4 + 1;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar4 + 1) {
    lj_state_growstack(L,1);
  }
  lua_setfield(L,-2,"isvararg");
  (L->top->field_2).it = -(pt->flags & 1) - 2;
  pTVar4 = L->top;
  L->top = pTVar4 + 1;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar4 + 1) {
    lj_state_growstack(L,1);
  }
  lua_setfield(L,-2,"children");
  pTVar4 = L->top;
  L->top = pTVar4 + 1;
  (pTVar4->field_2).field_0 =
       (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(pt->chunkname).gcptr32;
  (pTVar4->field_2).it = 0xfffffffb;
  lua_setfield(L,-2,"source");
  uVar8 = (ulong)(pt->chunkname).gcptr32;
  uVar2 = *(uint *)(uVar8 + 0xc);
  uVar3 = lj_debug_line(pt,uVar3);
  if (*(char *)(uVar8 + 0x10) == '@') {
    uVar5 = uVar2 + 1;
    pcVar6 = (char *)(uVar8 + (uVar2 - 1) + 0x11);
    pt = (GCproto *)(uVar8 + 0x11);
    do {
      if (uVar5 == 2) goto LAB_00149269;
      cVar1 = *pcVar6;
      uVar5 = uVar5 - 1;
    } while ((cVar1 != '\\') && (pcVar6 = pcVar6 + -1, cVar1 != '/'));
    pt = (GCproto *)((long)&(pt->nextgc).gcptr32 + (ulong)uVar5);
  }
  else {
    if (0x28 < uVar2) {
      pcVar6 = "%p:%d";
      goto LAB_00149276;
    }
    if (*(char *)(uVar8 + 0x10) != '=') {
      pt = (GCproto *)(uVar8 + 0x10);
      pcVar6 = "\"%s\":%d";
      goto LAB_00149276;
    }
    pt = (GCproto *)(uVar8 + 0x11);
  }
LAB_00149269:
  pcVar6 = "%s:%d";
LAB_00149276:
  lj_str_pushf(L,pcVar6,pt,(ulong)uVar3);
  lua_setfield(L,-2,"loc");
  return 1;
}

Assistant:

LJLIB_CF(jit_util_funcinfo)
{
  GCproto *pt = check_Lproto(L, 1);
  if (pt) {
    BCPos pc = (BCPos)lj_lib_optint(L, 2, 0);
    GCtab *t;
    lua_createtable(L, 0, 16);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "linedefined", pt->firstline);
    setintfield(L, t, "lastlinedefined", pt->firstline + pt->numline);
    setintfield(L, t, "stackslots", pt->framesize);
    setintfield(L, t, "params", pt->numparams);
    setintfield(L, t, "bytecodes", (int32_t)pt->sizebc);
    setintfield(L, t, "gcconsts", (int32_t)pt->sizekgc);
    setintfield(L, t, "nconsts", (int32_t)pt->sizekn);
    setintfield(L, t, "upvalues", (int32_t)pt->sizeuv);
    if (pc < pt->sizebc)
      setintfield(L, t, "currentline", lj_debug_line(pt, pc));
    lua_pushboolean(L, (pt->flags & PROTO_VARARG));
    lua_setfield(L, -2, "isvararg");
    lua_pushboolean(L, (pt->flags & PROTO_CHILD));
    lua_setfield(L, -2, "children");
    setstrV(L, L->top++, proto_chunkname(pt));
    lua_setfield(L, -2, "source");
    lj_debug_pushloc(L, pt, pc);
    lua_setfield(L, -2, "loc");
  } else {
    GCfunc *fn = funcV(L->base);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    if (!iscfunc(fn))
      setintfield(L, t, "ffid", fn->c.ffid);
    setintptrV(lj_tab_setstr(L, t, lj_str_newlit(L, "addr")),
	       (intptr_t)(void *)fn->c.f);
    setintfield(L, t, "upvalues", fn->c.nupvalues);
  }
  return 1;
}